

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

char * voc_read_oops(voccxdef *ctx,char *oopsbuf,size_t oopsbuflen,char *unknown_word)

{
  int iVar1;
  ushort **ppuVar2;
  __int32_t **pp_Var3;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  byte *pbVar7;
  char *pcVar8;
  
  pcVar8 = (char *)0x0;
  vocerr(ctx,2,"I don\'t know the word \"%s\".",oopsbuflen);
  iVar1 = vocread(ctx,0xffff,0xffff,oopsbuf,0x80,1);
  if (iVar1 == 0) {
    bVar6 = *oopsbuf;
    if (bVar6 != 0) {
      pbVar7 = (byte *)(oopsbuf + 1);
      do {
        if (-1 < (char)bVar6) {
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (ulong)bVar6 * 2 + 1) & 1) != 0) {
            pp_Var3 = __ctype_tolower_loc();
            bVar6 = *(byte *)(*pp_Var3 + bVar6);
          }
        }
        pbVar7[-1] = bVar6;
        bVar6 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (bVar6 != 0);
    }
    bVar6 = *oopsbuf;
    if (-1 < (char)bVar6) {
      ppuVar2 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar2 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) break;
        bVar6 = *(byte *)((long)oopsbuf + 1);
        oopsbuf = (char *)((long)oopsbuf + 1);
      } while (-1 < (char)bVar6);
    }
    sVar4 = strlen(oopsbuf);
    if (((sVar4 < 6) ||
        ((lVar5 = 5, (char)*(int *)((long)oopsbuf + 4) != ' ' || *(int *)oopsbuf != 0x73706f6f &&
         ((sVar4 < 6 || ((char)*(int *)((long)oopsbuf + 4) != ',' || *(int *)oopsbuf != 0x73706f6f))
         )))) && ((sVar4 < 3 ||
                  ((lVar5 = 2, (short)*(int *)oopsbuf != 0x206f &&
                   ((sVar4 < 3 || ((short)*(int *)oopsbuf != 0x2c6f)))))))) {
      pcVar8 = (char *)0x0;
    }
    else {
      pcVar8 = (char *)((long)oopsbuf + lVar5);
      bVar6 = *(byte *)((long)oopsbuf + lVar5);
      if (-1 < (char)bVar6) {
        ppuVar2 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar2 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) {
            return pcVar8;
          }
          bVar6 = pcVar8[1];
          pcVar8 = pcVar8 + 1;
        } while (-1 < (char)bVar6);
      }
    }
  }
  return pcVar8;
}

Assistant:

static char *voc_read_oops(voccxdef *ctx, char *oopsbuf, size_t oopsbuflen,
                           const char *unknown_word)
{
    char *p;
    
    /* display the error */
    vocerr(ctx, VOCERR(2), "I don't know the word \"%s\".", unknown_word);

    /* read a new command */
    if (vocread(ctx, MCMONINV, MCMONINV,
                oopsbuf, (int)oopsbuflen, 1) == VOCREAD_REDO)
    {
        /* 
         *   we've already decided it's not an OOPS input - return null to
         *   indicate to the caller that we have a new command 
         */
        return 0;
    }

    /* lower-case the string */
    for (p = oopsbuf ; *p != '\0' ; ++p)
        *p = (vocisupper(*p) ? tolower(*p) : *p);

    /* skip leading spaces */
    for (p = oopsbuf ; vocisspace(*p) ; ++p) ;

    /* 
     *   See if they are saying "oops".  Allow "oops" or simply "o",
     *   followed by either a space or a comma.  
     */
    if ((strlen(p) > 5 && memcmp(p, "oops ", 5) == 0)
        || (strlen(p) > 5 && memcmp(p, "oops,", 5) == 0))
    {
        /* we found "OOPS" - move to the next character */
        p += 5;
    }
    else if ((strlen(p) > 2 && memcmp(p, "o ", 2) == 0)
             || (strlen(p) > 2 && memcmp(p, "o,", 2) == 0))
    {
        /* we found "O" - move to the next character */
        p += 2;
    }
    else
    {
        /* 
         *   we didn't find any form of "OOPS" response - return null to
         *   indicate to the caller that the player entered a new command 
         */
        return 0;
    }

    /* skip spaces before the replacement text */
    for ( ; vocisspace(*p) ; ++p) ;

    /* return a pointer to the start of the replacement text */
    return p;
}